

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderInvarianceRule7Test::verifyResultData
          (TessellationShaderInvarianceRule7Test *this,void **all_iterations_data)

{
  ostringstream *poVar1;
  float *pfVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  MessageBuilder *this_00;
  TestError *this_01;
  int iVar9;
  long lVar10;
  int *piVar11;
  byte bVar12;
  byte bVar13;
  int *piVar14;
  undefined8 unaff_RBX;
  ulong uVar15;
  float *pfVar16;
  _tessellation_primitive_mode primitive_mode;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  byte bVar21;
  float fVar22;
  float fVar23;
  float fVar28;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float *base_triangle_vertex3;
  float *base_triangle_vertex2;
  float *base_triangle_vertex1;
  vector<int,_std::allocator<int>_> ref_iteration_indices;
  char *primitive_mode_str;
  vector<const_float_*,_std::allocator<const_float_*>_> outer_edge_vertices;
  float *local_280;
  float *local_278;
  uint local_26c;
  float *local_268;
  _tessellation_primitive_mode local_25c;
  vector<int,_std::allocator<int>_> local_258;
  ulong local_238;
  float *local_230;
  uint local_228;
  uint local_224;
  ulong local_220;
  TessellationShaderInvarianceRule7Test *local_218;
  long local_210;
  float *local_208;
  void **local_200;
  long local_1f8;
  ulong local_1f0;
  int *local_1e8;
  ulong local_1e0;
  void *local_1d8;
  ulong local_1d0;
  void *local_1c8;
  char *local_1c0;
  undefined1 local_1b8 [8];
  iterator iStack_1b0;
  float **local_1a8;
  ios_base local_140 [272];
  undefined1 auVar31 [16];
  
  uVar15 = CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
  local_218 = this;
  local_200 = all_iterations_data;
  do {
    if ((char)uVar15 == '\0') {
      local_238 = (ulong)(uint)((int)((ulong)((long)(this->m_test_triangles_iterations).
                                                                                                        
                                                  super__Vector_base<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)(this->m_test_triangles_iterations).
                                                                                                      
                                                  super__Vector_base<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                               -0x45d1745d);
      uVar17 = 4;
      primitive_mode = TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS;
      lVar19 = 0x2f8;
    }
    else {
      uVar17 = 3;
      primitive_mode = TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES;
      lVar19 = 0x2e0;
      local_238 = 0;
    }
    lVar10 = *(long *)((long)&(this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.
                              super_TestCase.super_TestNode._vptr_TestNode + lVar19);
    if (*(long *)((long)&(this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.
                         super_TestCase.super_TestNode.m_testCtx + lVar19) != lVar10) {
      local_1e0 = (ulong)-uVar17;
      local_220 = 0;
      local_26c = (uint)uVar15;
      local_224 = local_26c & 0xff;
      local_25c = primitive_mode;
      local_228 = uVar17;
      local_1f8 = lVar19;
      do {
        local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (int *)0x0;
        local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (int *)0x0;
        local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (int *)0x0;
        if (*(char *)(lVar10 + 0x20 + local_220 * 0x2c) == '\x01') {
          local_230 = (float *)(lVar10 + local_220 * 0x2c);
          pfVar2 = local_230 + 2;
          iVar9 = 1;
          do {
            uVar7 = getTestIterationIndex
                              (this,SUB41(local_224,0),local_230,pfVar2,
                               (_tessellation_shader_vertex_ordering)local_230[7],
                               (uint)((int)local_230[9] + iVar9) % uVar17);
            local_1b8._0_4_ = uVar7;
            if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&local_258,
                         (iterator)
                         local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)local_1b8);
            }
            else {
              *local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = uVar7;
              local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            iVar8 = (int)local_1e0 + iVar9;
            iVar9 = iVar9 + 1;
          } while (iVar8 != 0);
          if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_1f0 = (ulong)(uint)((int)local_238 + (int)local_220);
            uVar15 = (ulong)(uint)local_230[10];
            piVar11 = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            piVar14 = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pfVar16 = local_230;
            local_208 = pfVar2;
            do {
              if (2 < (uint)uVar15) {
                local_1d8 = local_200[local_1f0];
                local_1c8 = local_200[(uint)((int)local_238 + *piVar14)];
                local_210 = (long)*piVar14 * 0x2c +
                            *(long *)((long)&(this->super_TessellationShaderInvarianceBaseTest).
                                             super_TestCaseBase.super_TestCase.super_TestNode.
                                             _vptr_TestNode + lVar19);
                uVar18 = 0;
                local_1e8 = piVar14;
                do {
                  uVar15 = (ulong)(uint)((int)uVar18 * 9);
                  pfVar2 = (float *)((long)local_1d8 + uVar15 * 4);
                  local_278 = (float *)((long)local_1d8 + uVar15 * 4 + 0xc);
                  local_280 = (float *)((long)local_1d8 + uVar15 * 4 + 0x18);
                  local_268 = pfVar2;
                  bVar3 = TessellationShaderUtils::isOuterEdgeVertex(primitive_mode,pfVar2);
                  bVar4 = TessellationShaderUtils::isOuterEdgeVertex(primitive_mode,local_278);
                  local_1d0 = uVar18;
                  bVar5 = TessellationShaderUtils::isOuterEdgeVertex(primitive_mode,local_280);
                  if (bVar5 || (char)(bVar4 + bVar3) != '\0') {
                    if ((local_26c & 1) == 0) {
                      local_1b8 = (undefined1  [8])0x0;
                      iStack_1b0._M_current = (float **)0x0;
                      local_1a8 = (float **)0x0;
                      if (bVar3) {
                        std::vector<float_const*,std::allocator<float_const*>>::
                        _M_realloc_insert<float_const*const&>
                                  ((vector<float_const*,std::allocator<float_const*>> *)local_1b8,
                                   (iterator)0x0,&local_268);
                      }
                      if (bVar4) {
                        if (iStack_1b0._M_current == local_1a8) {
                          std::vector<float_const*,std::allocator<float_const*>>::
                          _M_realloc_insert<float_const*const&>
                                    ((vector<float_const*,std::allocator<float_const*>> *)local_1b8,
                                     iStack_1b0,&local_278);
                        }
                        else {
                          *iStack_1b0._M_current = local_278;
                          iStack_1b0._M_current = iStack_1b0._M_current + 1;
                        }
                      }
                      if (bVar5) {
                        if (iStack_1b0._M_current == local_1a8) {
                          std::vector<float_const*,std::allocator<float_const*>>::
                          _M_realloc_insert<float_const*const&>
                                    ((vector<float_const*,std::allocator<float_const*>> *)local_1b8,
                                     iStack_1b0,&local_280);
                        }
                        else {
                          *iStack_1b0._M_current = local_280;
                          iStack_1b0._M_current = iStack_1b0._M_current + 1;
                        }
                      }
                      if ((undefined1  [8])iStack_1b0._M_current == local_1b8) {
                        bVar6 = 1;
                        bVar3 = true;
                        bVar21 = 1;
                      }
                      else {
                        bVar6 = 1;
                        uVar15 = 0;
                        bVar3 = true;
                        bVar21 = 1;
                        do {
                          uVar18 = *(ulong *)((TestLog *)((long)local_1b8 + uVar15 * 8))->m_log;
                          auVar24._0_8_ = uVar18 ^ 0x8000000080000000;
                          auVar24._8_4_ = 0x80000000;
                          auVar24._12_4_ = 0x80000000;
                          auVar25._8_8_ = 0;
                          auVar25._0_8_ = uVar18;
                          auVar25 = maxps(auVar24,auVar25);
                          fVar22 = (float)uVar18 + -1.0;
                          auVar29._0_8_ =
                               CONCAT44((int)(uVar18 >> 0x20),fVar22) ^ 0x8000000080000000;
                          auVar29._8_4_ = 0x80000000;
                          auVar29._12_4_ = 0x80000000;
                          if (-fVar22 <= fVar22) {
                            auVar29._0_4_ = fVar22;
                          }
                          bVar6 = bVar6 & auVar29._0_4_ <= 1e-05;
                          bVar3 = (bool)(bVar3 & auVar25._0_4_ <= 1e-05);
                          bVar21 = bVar21 & -(auVar25._4_4_ <= 1e-05);
                          uVar15 = uVar15 + 1;
                        } while ((uVar15 & 0xffffffff) <
                                 (ulong)((long)iStack_1b0._M_current - (long)local_1b8 >> 3));
                      }
                      if ((long)iStack_1b0._M_current - (long)local_1b8 == 8) {
                        uVar15 = *(ulong *)*(qpTestLog **)local_1b8;
                        auVar26._8_8_ = 0;
                        auVar26._0_8_ = uVar15;
                        fVar28 = (float)(uVar15 >> 0x20);
                        fVar22 = (float)uVar15 + -1.0;
                        auVar30._0_8_ = uVar15 ^ 0x8000000080000000;
                        auVar30._8_4_ = 0x80000000;
                        auVar30._12_4_ = 0x80000000;
                        auVar25 = maxps(auVar30,auVar26);
                        iVar9 = -(uint)(1e-05 <= auVar25._0_4_);
                        iVar8 = -(uint)(1e-05 <= auVar25._4_4_);
                        auVar32._4_4_ = iVar8;
                        auVar32._0_4_ = iVar9;
                        auVar32._8_4_ = iVar8;
                        auVar32._12_4_ = iVar8;
                        auVar31._8_8_ = auVar32._8_8_;
                        auVar31._4_4_ = iVar9;
                        auVar31._0_4_ = iVar9;
                        iVar9 = movmskpd((int)*(qpTestLog **)local_1b8,auVar31);
                        if (iVar9 != 0) {
                          fVar23 = fVar28 + -1.0;
                          auVar33._0_8_ = CONCAT44(fVar28,fVar23) ^ 0x8000000080000000;
                          auVar33._8_4_ = -fVar28;
                          auVar33._12_4_ = -fVar28;
                          if (-fVar23 <= fVar23) {
                            auVar33._0_4_ = fVar23;
                          }
                          if ((~(byte)iVar9 & auVar33._0_4_ < 1e-05) == 0) {
                            auVar27._0_8_ = CONCAT44(fVar28,fVar22) ^ 0x8000000080000000;
                            auVar27._8_4_ = 0x80000000;
                            auVar27._12_4_ = 0x80000000;
                            if (-fVar22 <= fVar22) {
                              auVar27._0_4_ = fVar22;
                            }
                            bVar12 = (byte)iVar9 >> 1;
                            bVar4 = 1e-05 <= auVar27._0_4_;
                            bVar13 = bVar12 ^ 1 | bVar4;
                            bVar6 = bVar6 & (1e-05 <= auVar33._0_4_ | bVar13);
                            if (bVar13 != 0) {
                              bVar21 = (bVar4 | bVar12) & bVar21;
                            }
                          }
                          goto LAB_00d251d2;
                        }
LAB_00d251de:
                        uVar17 = 1;
                        if (bVar21 == 0) {
                          uVar17 = bVar6 ^ 3;
                        }
                      }
                      else {
LAB_00d251d2:
                        uVar17 = 0;
                        if (!bVar3) goto LAB_00d251de;
                      }
                      if (local_1b8 != (undefined1  [8])0x0) {
                        operator_delete((void *)local_1b8,(long)local_1a8 - (long)local_1b8);
                      }
                    }
                    else if ((bVar3) && ((*local_268 != 0.0 || (NAN(*local_268))))) {
LAB_00d24f6f:
                      if ((local_268[1] == 0.0) && (!NAN(local_268[1]))) {
LAB_00d24f7f:
                        if (((!bVar4) || ((local_278[1] == 0.0 && (!NAN(local_278[1]))))) &&
                           ((uVar17 = 1, !bVar5 || ((local_280[1] == 0.0 && (!NAN(local_280[1]))))))
                           ) goto LAB_00d25206;
                      }
                      uVar17 = 2;
                    }
                    else if (((bVar4) && ((*local_278 != 0.0 || (NAN(*local_278))))) ||
                            ((uVar17 = 0, bVar5 && ((*local_280 != 0.0 || (NAN(*local_280))))))) {
                      if (bVar3) goto LAB_00d24f6f;
                      goto LAB_00d24f7f;
                    }
LAB_00d25206:
                    primitive_mode = local_25c;
                    if (uVar17 != *(uint *)(local_210 + 0x24)) {
                      if (*(uint *)(local_210 + 0x28) < 3) {
LAB_00d25345:
                        local_1c0 = "quads";
                        if ((local_26c & 1) != 0) {
                          local_1c0 = "triangles";
                        }
                        local_1b8 = (undefined1  [8])
                                    ((local_218->super_TessellationShaderInvarianceBaseTest).
                                     super_TestCaseBase.super_TestCase.super_TestNode.m_testCtx)->
                                    m_log;
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_1b0);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&iStack_1b0,"For primitive mode [",0x14);
                        this_00 = tcu::MessageBuilder::operator<<
                                            ((MessageBuilder *)local_1b8,&local_1c0);
                        poVar1 = &this_00->m_str;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"] ",
                                   2);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                                   ", inner tessellation levels:",0x1c);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"[",1
                                  );
                        std::ostream::_M_insert<double>((double)*pfVar16);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",
                                   2);
                        std::ostream::_M_insert<double>((double)pfVar16[1]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                                   "], outer tessellation levels:",0x1d);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"[",1
                                  );
                        std::ostream::_M_insert<double>((double)*local_208);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",
                                   2);
                        std::ostream::_M_insert<double>((double)pfVar16[3]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",
                                   2);
                        std::ostream::_M_insert<double>((double)pfVar16[4]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",
                                   2);
                        std::ostream::_M_insert<double>((double)pfVar16[5]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                                   "], a triangle connecting inner & outer edges:",0x2d);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"[",1
                                  );
                        std::ostream::_M_insert<double>((double)*local_268);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",
                                   2);
                        std::ostream::_M_insert<double>((double)local_268[1]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",
                                   2);
                        std::ostream::_M_insert<double>((double)local_268[2]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]x",
                                   2);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"[",1
                                  );
                        std::ostream::_M_insert<double>((double)*local_278);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",
                                   2);
                        std::ostream::_M_insert<double>((double)local_278[1]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",
                                   2);
                        std::ostream::_M_insert<double>((double)local_278[2]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]x",
                                   2);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"[",1
                                  );
                        std::ostream::_M_insert<double>((double)*local_280);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",
                                   2);
                        std::ostream::_M_insert<double>((double)local_280[1]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",
                                   2);
                        std::ostream::_M_insert<double>((double)local_280[2]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                                   "] was not found for runs using CW and CCW vertex ordering, which is against the extension specification\'s rule 7."
                                   ,0x71);
                        tcu::MessageBuilder::operator<<
                                  (this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_1b0);
                        std::ios_base::~ios_base(local_140);
                        this_01 = (TestError *)__cxa_allocate_exception(0x38);
                        tcu::TestError::TestError
                                  (this_01,
                                   "Implementation is not conformant with Tessellation Rule 7",
                                   (char *)0x0,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                                   ,0xc3d);
                        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
                      }
                      uVar20 = (ulong)*(uint *)(local_210 + 0x28) / 3;
                      bVar3 = true;
                      uVar18 = 1;
                      uVar15 = 0;
                      do {
                        bVar4 = TessellationShaderUtils::isTriangleDefined
                                          ((float *)((long)local_1c8 + (uVar15 & 0xffffffff) * 4),
                                           pfVar2);
                        if (bVar4) break;
                        bVar3 = uVar18 < uVar20;
                        uVar15 = uVar15 + 9;
                        uVar18 = uVar18 + 1;
                      } while (uVar20 * 9 != uVar15);
                      pfVar16 = local_230;
                      primitive_mode = local_25c;
                      if (!bVar3) goto LAB_00d25345;
                    }
                  }
                  uVar18 = local_1d0 + 1;
                  uVar15 = (ulong)(uint)pfVar16[10];
                  piVar11 = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                  piVar14 = local_1e8;
                  lVar19 = local_1f8;
                  this = local_218;
                  uVar17 = local_228;
                } while (uVar18 < uVar15 / 3);
              }
              piVar14 = piVar14 + 1;
            } while (piVar14 != piVar11);
          }
          uVar15 = (ulong)local_26c;
          if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (int *)0x0) {
            operator_delete(local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
        }
        local_220 = (ulong)((int)local_220 + 1);
        lVar10 = *(long *)((long)&(this->super_TessellationShaderInvarianceBaseTest).
                                  super_TestCaseBase.super_TestCase.super_TestNode._vptr_TestNode +
                          lVar19);
        uVar18 = (*(long *)((long)&(this->super_TessellationShaderInvarianceBaseTest).
                                   super_TestCaseBase.super_TestCase.super_TestNode.m_testCtx +
                           lVar19) - lVar10 >> 2) * 0x2e8ba2e8ba2e8ba3;
      } while (local_220 <= uVar18 && uVar18 - local_220 != 0);
    }
    uVar18 = uVar15 & 1;
    uVar15 = 0;
    if (uVar18 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void TessellationShaderInvarianceRule7Test::verifyResultData(const void** all_iterations_data)
{
	const float epsilon = 1e-5f;

	/* Run two separate iterations:
	 *
	 * a) triangles
	 * b) quads
	 */
	for (unsigned int n_iteration = 0; n_iteration < 2 /* triangles, quads */; ++n_iteration)
	{
		bool			   is_triangles_iteration = (n_iteration == 0);
		const unsigned int n_base_iteration =
			(n_iteration == 0) ? 0 : (const unsigned int)m_test_triangles_iterations.size();
		const unsigned int n_relevant_outer_tess_levels = (is_triangles_iteration) ? 3 : 4;

		_tessellation_primitive_mode primitive_mode = (n_iteration == 0) ?
														  TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES :
														  TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS;

		const _test_iterations& test_iterations =
			(n_iteration == 0) ? m_test_triangles_iterations : m_test_quads_iterations;

		DE_ASSERT(test_iterations.size() != 0);

		/* Find a base iteration first */
		for (unsigned int n_base_test_iteration = 0; n_base_test_iteration < test_iterations.size();
			 n_base_test_iteration++)
		{
			const _test_iteration& base_iteration = test_iterations[n_base_test_iteration];
			std::vector<int>	   ref_iteration_indices;

			if (!base_iteration.is_base_iteration)
			{
				continue;
			}

			/* Retrieve reference test iterations */
			for (unsigned int n_reference_iteration = 0; n_reference_iteration < n_relevant_outer_tess_levels;
				 ++n_reference_iteration)
			{
				const unsigned int n_modified_outer_tess_level =
					(base_iteration.n_modified_outer_tess_level + n_reference_iteration + 1) %
					n_relevant_outer_tess_levels;
				const unsigned int ref_iteration_index = getTestIterationIndex(
					is_triangles_iteration, base_iteration.inner_tess_levels, base_iteration.outer_tess_levels,
					base_iteration.vertex_ordering, n_modified_outer_tess_level);

				DE_ASSERT(ref_iteration_index != 0xFFFFFFFF);
				DE_ASSERT(ref_iteration_index != n_base_test_iteration);

				ref_iteration_indices.push_back(ref_iteration_index);
			}

			/* We can now start comparing base data with the information generated for
			 * reference iterations. */
			for (std::vector<int>::const_iterator ref_iteration_iterator = ref_iteration_indices.begin();
				 ref_iteration_iterator != ref_iteration_indices.end(); ref_iteration_iterator++)
			{
				const int&			   n_ref_test_iteration = *ref_iteration_iterator;
				const _test_iteration& ref_iteration		= test_iterations[n_ref_test_iteration];

				/* Now move through all triangles generated for base test iteration. Focus on the ones
				 * that connect the outer edge with one of the inner ones */
				const float* base_iteration_vertex_data =
					(const float*)all_iterations_data[n_base_iteration + n_base_test_iteration];
				const float* ref_iteration_vertex_data =
					(const float*)all_iterations_data[n_base_iteration + n_ref_test_iteration];

				for (unsigned int n_base_triangle = 0;
					 n_base_triangle < base_iteration.n_vertices / 3; /* vertices per triangle */
					 ++n_base_triangle)
				{
					const float* base_triangle_data =
						base_iteration_vertex_data + n_base_triangle * 3 /* vertices */ * 3; /* components */

					/* Is that the triangle type we're after? */
					const float* base_triangle_vertex1 = base_triangle_data;
					const float* base_triangle_vertex2 = base_triangle_vertex1 + 3; /* components */
					const float* base_triangle_vertex3 = base_triangle_vertex2 + 3; /* components */
					bool		 is_base_triangle_vertex1_outer =
						TessellationShaderUtils::isOuterEdgeVertex(primitive_mode, base_triangle_vertex1);
					bool is_base_triangle_vertex2_outer =
						TessellationShaderUtils::isOuterEdgeVertex(primitive_mode, base_triangle_vertex2);
					bool is_base_triangle_vertex3_outer =
						TessellationShaderUtils::isOuterEdgeVertex(primitive_mode, base_triangle_vertex3);
					unsigned int n_outer_edge_vertices_found = 0;

					n_outer_edge_vertices_found += (is_base_triangle_vertex1_outer == true);
					n_outer_edge_vertices_found += (is_base_triangle_vertex2_outer == true);
					n_outer_edge_vertices_found += (is_base_triangle_vertex3_outer == true);

					if (n_outer_edge_vertices_found == 0)
					{
						/* This is an inner triangle, not really of our interest */
						continue;
					}

					/* Which outer tessellation level describes the base data edge? */
					unsigned int n_base_tess_level = 0;

					if (primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES)
					{
						if ((!is_base_triangle_vertex1_outer ||
							 (is_base_triangle_vertex1_outer && base_triangle_vertex1[0] == 0.0f)) &&
							(!is_base_triangle_vertex2_outer ||
							 (is_base_triangle_vertex2_outer && base_triangle_vertex2[0] == 0.0f)) &&
							(!is_base_triangle_vertex3_outer ||
							 (is_base_triangle_vertex3_outer && base_triangle_vertex3[0] == 0.0f)))
						{
							n_base_tess_level = 0;
						}
						else if ((!is_base_triangle_vertex1_outer ||
								  (is_base_triangle_vertex1_outer && base_triangle_vertex1[1] == 0.0f)) &&
								 (!is_base_triangle_vertex2_outer ||
								  (is_base_triangle_vertex2_outer && base_triangle_vertex2[1] == 0.0f)) &&
								 (!is_base_triangle_vertex3_outer ||
								  (is_base_triangle_vertex3_outer && base_triangle_vertex3[1] == 0.0f)))
						{
							n_base_tess_level = 1;
						}
						else
						{
							DE_ASSERT((!is_base_triangle_vertex1_outer ||
									   (is_base_triangle_vertex1_outer && base_triangle_vertex1[2] == 0.0f)) &&
									  (!is_base_triangle_vertex2_outer ||
									   (is_base_triangle_vertex2_outer && base_triangle_vertex2[2] == 0.0f)) &&
									  (!is_base_triangle_vertex3_outer ||
									   (is_base_triangle_vertex3_outer && base_triangle_vertex3[2] == 0.0f)));

							n_base_tess_level = 2;
						}
					} /* if (primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES) */
					else
					{
						DE_ASSERT(primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS);

						std::size_t				  n_outer_edge_vertices = 0;
						std::vector<const float*> outer_edge_vertices;

						if (is_base_triangle_vertex1_outer)
						{
							outer_edge_vertices.push_back(base_triangle_vertex1);
						}

						if (is_base_triangle_vertex2_outer)
						{
							outer_edge_vertices.push_back(base_triangle_vertex2);
						}

						if (is_base_triangle_vertex3_outer)
						{
							outer_edge_vertices.push_back(base_triangle_vertex3);
						}

						n_outer_edge_vertices = outer_edge_vertices.size();

						DE_ASSERT(n_outer_edge_vertices >= 1 && n_outer_edge_vertices <= 2);

						bool is_top_outer_edge	= true;
						bool is_right_outer_edge  = true;
						bool is_bottom_outer_edge = true;
						bool is_left_outer_edge   = true;

						/* Find which outer edges the vertices don't belong to. If one is in a corner,
						 * the other will clarify to which edge both vertices belong. */
						for (unsigned int n_vertex = 0; n_vertex < n_outer_edge_vertices; ++n_vertex)
						{
							/* Y < 1, not top outer edge */
							if (de::abs(outer_edge_vertices[n_vertex][1] - 1.0f) > epsilon)
							{
								is_top_outer_edge = false;
							}

							/* X < 1, not right outer edge */
							if (de::abs(outer_edge_vertices[n_vertex][0] - 1.0f) > epsilon)
							{
								is_right_outer_edge = false;
							}

							/* Y > 0, not bottom outer edge */
							if (de::abs(outer_edge_vertices[n_vertex][1]) > epsilon)
							{
								is_bottom_outer_edge = false;
							}

							/* X > 0, not left outer edge */
							if (de::abs(outer_edge_vertices[n_vertex][0]) > epsilon)
							{
								is_left_outer_edge = false;
							}
						}

						if (n_outer_edge_vertices == 1)
						{
							/* A single vertex with corner-coordinates belongs to two edges. Choose one */
							bool x_is_0 = de::abs(outer_edge_vertices[0][0]) < epsilon;
							bool x_is_1 = de::abs(outer_edge_vertices[0][0] - 1.0f) < epsilon;
							bool y_is_0 = de::abs(outer_edge_vertices[0][1]) < epsilon;
							bool y_is_1 = de::abs(outer_edge_vertices[0][1] - 1.0f) < epsilon;

							if (x_is_0 && y_is_0)
							{
								/* bottom edge */
								DE_ASSERT(is_left_outer_edge && is_bottom_outer_edge);
								is_left_outer_edge = false;
							}
							else if (x_is_0 && y_is_1)
							{
								/* left edge */
								DE_ASSERT(is_left_outer_edge && is_top_outer_edge);
								is_top_outer_edge = false;
							}
							else if (x_is_1 && y_is_0)
							{
								/* right edge */
								DE_ASSERT(is_right_outer_edge && is_bottom_outer_edge);
								is_bottom_outer_edge = false;
							}
							else if (x_is_1 && y_is_1)
							{
								/* top edge */
								DE_ASSERT(is_right_outer_edge && is_top_outer_edge);
								is_right_outer_edge = false;
							}
							else
							{
								/* Not a corner vertex, only one of the edge-flags is set */
							}
						}

						/* Sanity checks */
						DE_UNREF(is_top_outer_edge);
						DE_ASSERT((is_left_outer_edge && !is_top_outer_edge && !is_bottom_outer_edge &&
								   !is_right_outer_edge) ||
								  (!is_left_outer_edge && is_top_outer_edge && !is_bottom_outer_edge &&
								   !is_right_outer_edge) ||
								  (!is_left_outer_edge && !is_top_outer_edge && is_bottom_outer_edge &&
								   !is_right_outer_edge) ||
								  (!is_left_outer_edge && !is_top_outer_edge && !is_bottom_outer_edge &&
								   is_right_outer_edge));

						/* We have all the data needed to determine which tessellation level describes
						 * subdivision of the edge that the triangle touches */
						if (is_left_outer_edge)
						{
							n_base_tess_level = 0;
						}
						else if (is_bottom_outer_edge)
						{
							n_base_tess_level = 1;
						}
						else if (is_right_outer_edge)
						{
							n_base_tess_level = 2;
						}
						else
						{
							n_base_tess_level = 3;
						}
					}

					/* We shouldn't perform the check if the edge we're processing was described
					 * by a different outer tessellation level in the reference data set */
					if (n_base_tess_level == ref_iteration.n_modified_outer_tess_level)
					{
						continue;
					}

					/* This triangle should be present in both vertex data sets */
					if (!isTriangleDefinedInVertexDataSet(base_triangle_data, ref_iteration_vertex_data,
														  ref_iteration.n_vertices))
					{
						const char* primitive_mode_str = (is_triangles_iteration) ? "triangles" : "quads";

						m_testCtx.getLog()
							<< tcu::TestLog::Message << "For primitive mode [" << primitive_mode_str << "] "
							<< ", inner tessellation levels:"
							<< "[" << base_iteration.inner_tess_levels[0] << ", " << base_iteration.inner_tess_levels[1]
							<< "], outer tessellation levels:"
							<< "[" << base_iteration.outer_tess_levels[0] << ", " << base_iteration.outer_tess_levels[1]
							<< ", " << base_iteration.outer_tess_levels[2] << ", "
							<< base_iteration.outer_tess_levels[3] << "], a triangle connecting inner & outer edges:"
							<< "[" << base_triangle_vertex1[0] << ", " << base_triangle_vertex1[1] << ", "
							<< base_triangle_vertex1[2] << "]x"
							<< "[" << base_triangle_vertex2[0] << ", " << base_triangle_vertex2[1] << ", "
							<< base_triangle_vertex2[2] << "]x"
							<< "[" << base_triangle_vertex3[0] << ", " << base_triangle_vertex3[1] << ", "
							<< base_triangle_vertex3[2] << "] was not found for runs using CW and CCW vertex ordering, "
														   "which is against the extension specification's rule 7."
							<< tcu::TestLog::EndMessage;

						TCU_FAIL("Implementation is not conformant with Tessellation Rule 7");
					}
				} /* for (all triangles generated for base test iteration) */
			}	 /* for (all reference iterations) */
		}		  /* for (all base test iterations) */
	}			  /* for (both primitive types) */
}